

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O0

DOMNode * __thiscall xercesc_4_0::DOMAttrMapImpl::removeNamedItem(DOMAttrMapImpl *this,XMLCh *name)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMException *pDVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMNode *p;
  undefined4 extraout_var_03;
  DOMNodeImpl *pDVar5;
  undefined4 extraout_var_04;
  long *plVar6;
  undefined8 uVar7;
  DOMNode *local_d8;
  MemoryManager *local_d0;
  DOMDocumentImpl *local_c0;
  long local_b0;
  MemoryManager *local_a0;
  MemoryManager *local_90;
  DOMDocumentImpl *local_80;
  long local_70;
  MemoryManager *local_60;
  DOMAttr *newAttr;
  DOMAttr *attr;
  DOMAttrMapImpl *defAttrs;
  DOMNode *removed;
  int i;
  XMLCh *name_local;
  DOMAttrMapImpl *this_local;
  
  bVar1 = readOnly(this);
  if (bVar1) {
    pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fOwnerNode == (DOMNode *)0x0) {
      local_60 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var,iVar2) == 0) {
        local_70 = 0;
      }
      else {
        local_70 = CONCAT44(extraout_var,iVar2) + -8;
      }
      if (local_70 == 0) {
        local_90 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_00,iVar2) == 0) {
          local_80 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_80 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar2) + -8);
        }
        local_90 = DOMDocumentImpl::getMemoryManager(local_80);
      }
      local_60 = local_90;
    }
    DOMException::DOMException(pDVar4,7,0,local_60);
    __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
  }
  iVar2 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xe])(this,name);
  if (-1 < iVar2) {
    p = DOMNodeVector::elementAt(this->fNodes,(long)iVar2);
    DOMNodeVector::removeElementAt(this->fNodes,(long)iVar2);
    iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
    local_d8 = (DOMNode *)0x0;
    if (CONCAT44(extraout_var_03,iVar2) != 0) {
      local_d8 = (DOMNode *)(CONCAT44(extraout_var_03,iVar2) + 0x18);
    }
    pDVar5 = xercesc_4_0::castToNodeImpl(p);
    pDVar5->fOwnerNode = local_d8;
    pDVar5 = xercesc_4_0::castToNodeImpl(p);
    DOMNodeImpl::isOwned(pDVar5,false);
    uVar3 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xc])();
    if (((uVar3 & 1) != 0) && (p != (DOMNode *)0x0)) {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0x4a])();
      plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x20))
                                 ((long *)CONCAT44(extraout_var_04,iVar2),name);
      if (plVar6 != (long *)0x0) {
        uVar7 = (**(code **)(*plVar6 + 0x68))(plVar6,1);
        (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[2])(this,uVar7);
      }
    }
    return p;
  }
  pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this->fOwnerNode == (DOMNode *)0x0) {
    local_a0 = XMLPlatformUtils::fgMemoryManager;
  }
  else {
    iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
    if (CONCAT44(extraout_var_01,iVar2) == 0) {
      local_b0 = 0;
    }
    else {
      local_b0 = CONCAT44(extraout_var_01,iVar2) + -8;
    }
    if (local_b0 == 0) {
      local_d0 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_02,iVar2) == 0) {
        local_c0 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_c0 = (DOMDocumentImpl *)(CONCAT44(extraout_var_02,iVar2) + -8);
      }
      local_d0 = DOMDocumentImpl::getMemoryManager(local_c0);
    }
    local_a0 = local_d0;
  }
  DOMException::DOMException(pDVar4,8,0,local_a0);
  __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMAttrMapImpl::removeNamedItem(const XMLCh *name)
{
    if (this->readOnly())
        throw DOMException(
            DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    int i=findNamePoint(name);
    DOMNode *removed = 0;

    if(i<0)
        throw DOMException(DOMException::NOT_FOUND_ERR, 0, GetDOMNamedNodeMapMemoryManager);

    removed = fNodes->elementAt(i);
    fNodes->removeElementAt(i);
    castToNodeImpl(removed)->fOwnerNode = fOwnerNode->getOwnerDocument();
    castToNodeImpl(removed)->isOwned(false);

    // Replace it if it had a default value
    // (DOM spec level 1 - Element Interface)
    if (hasDefaults() && (removed != 0))
    {
        DOMAttrMapImpl* defAttrs = ((DOMElementImpl*)fOwnerNode)->getDefaultAttributes();
        DOMAttr* attr = (DOMAttr*)(defAttrs->getNamedItem(name));
        if (attr != 0)
        {
            DOMAttr* newAttr = (DOMAttr*)attr->cloneNode(true);
            setNamedItem(newAttr);
        }
    }

    return removed;
}